

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

void __thiscall HEkk::unapplyTabooRowOut(HEkk *this,vector<double,_std::allocator<double>_> *values)

{
  double dVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  vector<double,_std::allocator<double>_> *in_RSI;
  long in_RDI;
  HighsInt iX;
  int local_14;
  
  sVar2 = std::
          vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
          ::size((vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
                  *)(in_RDI + 0x3880));
  local_14 = (int)sVar2;
  while (local_14 = local_14 + -1, -1 < local_14) {
    pvVar3 = std::
             vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
             ::operator[]((vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
                           *)(in_RDI + 0x3880),(long)local_14);
    if ((pvVar3->taboo & 1U) != 0) {
      pvVar3 = std::
               vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
               ::operator[]((vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
                             *)(in_RDI + 0x3880),(long)local_14);
      dVar1 = pvVar3->save_value;
      pvVar3 = std::
               vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
               ::operator[]((vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
                             *)(in_RDI + 0x3880),(long)local_14);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_RSI,(long)pvVar3->row_out);
      *pvVar4 = dVar1;
    }
  }
  return;
}

Assistant:

void HEkk::unapplyTabooRowOut(vector<double>& values) {
  assert((HighsInt)values.size() >= lp_.num_row_);
  // Unapply taboo rows in opposite order in case the row appears
  // twice in the list. This way the first saved value for the row is
  // what remains, not overwrite_with
  for (HighsInt iX = (HighsInt)bad_basis_change_.size() - 1; iX >= 0; iX--) {
    if (bad_basis_change_[iX].taboo)
      values[bad_basis_change_[iX].row_out] = bad_basis_change_[iX].save_value;
  }
}